

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_platform.hpp
# Opt level: O0

LoaderPlatformLibraryHandle LoaderPlatformLibraryOpen(string *path)

{
  undefined8 uVar1;
  LoaderPlatformLibraryHandle pvVar2;
  string *path_local;
  
  uVar1 = std::__cxx11::string::c_str();
  pvVar2 = (LoaderPlatformLibraryHandle)dlopen(uVar1,1);
  return pvVar2;
}

Assistant:

static inline LoaderPlatformLibraryHandle LoaderPlatformLibraryOpen(const std::string &path) {
    // When loading the library, we use RTLD_LAZY so that not all symbols have to be
    // resolved at this time (which improves performance). Note that if not all symbols
    // can be resolved, this could cause crashes later.
    // For experimenting/debugging: Define the LD_BIND_NOW environment variable to force all
    // symbols to be resolved here.
    return dlopen(path.c_str(), RTLD_LAZY | RTLD_LOCAL);
}